

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

gdImagePtr gdImageScale(gdImagePtr src,uint new_width,uint new_height)

{
  byte bVar1;
  gdInterpolationMethod gVar2;
  int **ppiVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  gdImagePtr pgVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  gdFixed f_dx;
  gdFixed f_dy;
  long dst_h;
  long dst_w;
  uint local_b8 [4];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78 [4];
  uint local_68;
  uint local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  uint local_44;
  uint local_40;
  uint local_3c;
  int **local_38;
  
  if (src == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  gVar2 = src->interpolation_id;
  if (GD_LINEAR < gVar2) {
    return (gdImagePtr)0x0;
  }
  if (new_height == 0 || new_width == 0) {
    return (gdImagePtr)0x0;
  }
  uVar41 = src->sx;
  if ((uVar41 == new_width) && (src->sy == new_height)) {
    pgVar7 = gdImageClone(src);
    return pgVar7;
  }
  if ((int)gVar2 < 0x10) {
    if (gVar2 - GD_BICUBIC < 2) {
      uVar40 = new_width + (new_width == 0);
      uVar38 = new_height + (new_height == 0);
      iVar12 = src->sy;
      if (src->trueColor == 0) {
        gdImagePaletteToTrueColor(src);
      }
      pgVar7 = gdImageCreateTrueColor(uVar40,uVar38);
      if (pgVar7 == (gdImagePtr)0x0) {
        return (gdImagePtr)0x0;
      }
      pgVar7->saveAlphaFlag = 1;
      local_38 = pgVar7->tpixels;
      lVar10 = (long)(int)uVar41 + -1;
      lVar33 = (long)(int)uVar41 + -2;
      lVar20 = (long)iVar12 + -1;
      ppiVar3 = src->tpixels;
      uVar17 = 0;
      do {
        lVar35 = uVar17 * (long)(((float)iVar12 / (float)uVar38) * 256.0) * 0x100;
        lVar36 = lVar35 >> 0x10;
        lVar21 = lVar36 * 0x100 - (lVar35 >> 8);
        piVar4 = local_38[uVar17];
        uVar16 = 0;
        do {
          lVar13 = uVar16 * (long)(((float)(int)uVar41 / (float)uVar40) * 256.0) * 0x100;
          lVar8 = lVar13 >> 0x10;
          local_78[1] = (uint)((ulong)lVar13 >> 0x10);
          local_5c = local_78[1] + 2;
          if (lVar33 <= lVar8) {
            local_5c = local_78[1];
          }
          local_68 = local_78[1] - 1;
          if (lVar8 < 1) {
            local_68 = local_78[1];
          }
          local_78[3] = local_5c;
          local_78[0] = local_68;
          if (lVar36 < 1) {
            local_78[3] = local_78[1];
            local_78[0] = local_78[1];
          }
          local_78[2] = ((byte)~(lVar36 < 1 || lVar10 <= lVar8) & 1) + local_78[1];
          local_58 = local_68;
          if (lVar20 <= lVar36) {
            local_58 = local_78[1];
          }
          local_64 = local_78[1];
          local_60 = (lVar8 < lVar10) + local_78[1];
          if (lVar20 <= lVar36) {
            local_5c = local_78[1];
          }
          local_54 = local_78[1];
          local_50 = (lVar36 < lVar20 && lVar10 > lVar8) + local_78[1];
          local_b8[0] = (uint)((ulong)lVar35 >> 0x10);
          local_b8[1] = local_b8[0];
          local_b8[2] = local_b8[0];
          local_b8[3] = local_b8[0];
          local_a8 = local_b8[0];
          local_a4 = local_b8[0];
          local_a0 = local_b8[0];
          local_9c = local_b8[0];
          local_98 = local_b8[0];
          local_94 = local_b8[0];
          local_90 = local_b8[0];
          local_4c = local_5c;
          local_8c = local_b8[0];
          local_88 = local_b8[0];
          local_40 = local_78[1];
          if (lVar36 < iVar12 + -2) {
            local_44 = local_78[1];
            local_84 = local_b8[0];
            local_40 = (lVar8 < lVar10) + local_78[1];
          }
          lVar13 = lVar8 * 0x100 - (lVar13 >> 8);
          local_3c = local_78[1] + 2;
          if (lVar33 <= lVar8) {
            local_3c = local_78[1];
          }
          local_80 = local_b8[0];
          if (iVar12 + -2 <= lVar36) {
            local_3c = local_78[1];
          }
          local_7c = local_b8[0];
          lVar8 = -1;
          lVar24 = 0;
          lVar34 = 0;
          lVar42 = 0;
          lVar28 = 0;
          lVar37 = 0;
          do {
            lVar14 = lVar8 * 0x100;
            lVar22 = lVar14 + lVar21;
            if (lVar22 < -0x1ff) {
              uVar9 = 0;
            }
            else {
              lVar30 = lVar22 + 0x200;
              uVar9 = ((ulong)(lVar30 * lVar30) >> 8) * lVar30 >> 8;
            }
            if (lVar22 < -0xff) {
              uVar32 = 0;
            }
            else {
              lVar30 = lVar14 + lVar21 + 0x100;
              uVar32 = ((ulong)(lVar30 * lVar30) >> 8) * lVar30 >> 6 & 0x7ffffffffffffc;
            }
            if (lVar22 < 1) {
              lVar30 = 0;
            }
            else {
              lVar30 = (((ulong)(lVar22 * lVar22) >> 8) * lVar22 >> 7 & 0xfffffffffffffffe) * 3;
            }
            if (lVar22 < 0x101) {
              uVar15 = 0;
            }
            else {
              lVar22 = lVar21 + lVar14 + -0x100;
              uVar15 = ((ulong)(lVar22 * lVar22) >> 8) * lVar22 >> 6 & 0x7ffffffffffffc;
            }
            lVar30 = ((uVar9 + lVar30) - (uVar32 + uVar15)) * 0x100;
            lVar22 = lVar30 >> 0x3f;
            lVar26 = 0;
            lVar14 = lVar24;
            do {
              lVar23 = lVar13 + lVar26 + -0x100;
              if (lVar23 < -0x1ff) {
                uVar9 = 0;
              }
              else {
                lVar31 = lVar13 + lVar26 + 0x100;
                uVar9 = ((ulong)(lVar31 * lVar31) >> 8) * lVar31 >> 8;
              }
              if (lVar23 < -0xff) {
                uVar32 = 0;
              }
              else {
                lVar31 = lVar13 + lVar26;
                uVar32 = ((ulong)(lVar31 * lVar31) >> 8) * lVar31 >> 6 & 0x7ffffffffffffc;
              }
              if (lVar23 < 1) {
                lVar31 = 0;
              }
              else {
                lVar31 = (((ulong)(lVar23 * lVar23) >> 8) * lVar23 >> 7 & 0xfffffffffffffffe) * 3;
              }
              if (lVar23 < 0x101) {
                uVar15 = 0;
              }
              else {
                lVar23 = lVar13 + lVar26 + -0x200;
                uVar15 = ((ulong)(lVar23 * lVar23) >> 8) * lVar23 >> 6 & 0x7ffffffffffffc;
              }
              lVar23 = ((long)(((uVar9 + lVar31) - (uVar32 + uVar15)) * 0x100) / 0x600) *
                       ((lVar30 / 6 + lVar22 >> 8) - lVar22) >> 8;
              uVar5 = ppiVar3[*(uint *)((long)local_b8 + lVar14)]
                      [*(uint *)((long)local_78 + lVar14)];
              lVar34 = lVar34 + ((long)((ulong)(uVar5 >> 8 & 0xff00) * lVar23) >> 8);
              lVar42 = lVar42 + ((long)((ulong)(uVar5 & 0xff00) * lVar23) >> 8);
              lVar28 = lVar28 + ((long)((ulong)((uVar5 & 0xff) << 8) * lVar23) >> 8);
              lVar37 = lVar37 + ((long)((ulong)(uVar5 >> 0x10 & 0x7f00) * lVar23) >> 8);
              lVar26 = lVar26 + 0x100;
              lVar14 = lVar14 + 4;
            } while (lVar26 != 0x400);
            lVar8 = lVar8 + 1;
            lVar24 = lVar24 + 0x10;
          } while (lVar8 != 3);
          lVar8 = lVar34 * 0x10a >> 0x10;
          uVar5 = 0xff0000;
          if (lVar8 < 0x100) {
            if (lVar8 < 0) {
              uVar5 = 0;
            }
            else {
              uVar5 = ((uint)((ulong)(lVar34 * 0x10a) >> 0x10) & 0xff) << 0x10;
            }
          }
          lVar8 = lVar42 * 0x10a >> 0x10;
          uVar11 = 0xff00;
          if (lVar8 < 0x100) {
            if (lVar8 < 0) {
              uVar11 = 0;
            }
            else {
              uVar11 = ((uint)((ulong)(lVar42 * 0x10a) >> 0x10) & 0xff) << 8;
            }
          }
          lVar8 = lVar28 * 0x10a >> 0x10;
          uVar18 = 0xff;
          if (lVar8 < 0x100) {
            if (lVar8 < 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = (uint)((ulong)(lVar28 * 0x10a) >> 0x10) & 0xff;
            }
          }
          lVar8 = lVar37 * 0x10a >> 0x10;
          uVar27 = 0x7f000000;
          if (lVar8 < 0x80) {
            if (lVar8 < 0) {
              uVar27 = 0;
            }
            else {
              uVar27 = (int)((ulong)(lVar37 * 0x10a) >> 0x10) << 0x18;
            }
          }
          piVar4[uVar16] = uVar11 | uVar5 | uVar18 | uVar27;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar40);
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar38);
      return pgVar7;
    }
    if (gVar2 != GD_BILINEAR_FIXED) {
LAB_0011a266:
      if (src->interpolation == (interpolation_method)0x0) {
        return (gdImagePtr)0x0;
      }
      pgVar7 = gdImageScaleTwoPass(src,new_width,new_height);
      return pgVar7;
    }
  }
  else if (gVar2 != GD_LINEAR) {
    if (gVar2 == GD_NEAREST_NEIGHBOUR) {
      pgVar7 = gdImageScaleNearestNeighbour(src,new_width,new_height);
      return pgVar7;
    }
    goto LAB_0011a266;
  }
  uVar17 = (ulong)(new_width + (new_width == 0));
  uVar16 = (ulong)(new_height + (new_height == 0));
  lVar10 = (long)(((float)(int)uVar41 / (float)uVar17) * 256.0);
  lVar20 = (long)(((float)src->sy / (float)uVar16) * 256.0);
  if (src->trueColor == 0) {
    uVar41 = src->transparent;
    pgVar7 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar7 != (gdImagePtr)0x0) {
      if ((int)uVar41 < 0) {
        iVar12 = -1;
      }
      else {
        iVar12 = src->green[uVar41] * 0x100 +
                 src->red[uVar41] * 0x10000 + src->alpha[uVar41] * 0x1000000 + src->blue[uVar41];
      }
      pgVar7->transparent = iVar12;
      uVar9 = 0;
      do {
        lVar21 = uVar9 * lVar20 * 0x100;
        lVar33 = (lVar21 >> 8) + (lVar21 >> 0x10) * -0x100;
        iVar39 = (int)((ulong)lVar21 >> 0x10);
        iVar12 = iVar39 + 1;
        lVar21 = 0;
        uVar32 = 0;
        do {
          iVar19 = (int)((ulong)lVar21 >> 0x10);
          iVar6 = gdImageBoundsSafe(src,iVar19,iVar39);
          uVar41 = 0;
          if ((iVar6 != 0) && (bVar1 = src->pixels[iVar39][iVar19], src->transparent != (uint)bVar1)
             ) {
            uVar41 = src->green[bVar1] * 0x100 +
                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 + src->blue[bVar1];
          }
          iVar25 = iVar19 + 1;
          iVar6 = gdImageBoundsSafe(src,iVar25,iVar39);
          uVar38 = uVar41;
          if (iVar6 != 0) {
            bVar1 = src->pixels[iVar39][iVar25];
            if (src->transparent == (uint)bVar1) {
              if (uVar41 == 0xffffffff) {
                uVar38 = 0x7f000000;
              }
            }
            else {
              uVar38 = src->green[bVar1] * 0x100 +
                       src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 + src->blue[bVar1];
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar19,iVar12);
          uVar15 = (ulong)uVar41;
          if (iVar6 != 0) {
            bVar1 = src->pixels[iVar12][iVar19];
            if (src->transparent == (uint)bVar1) {
              uVar15 = (ulong)uVar41;
              if (uVar41 == 0xffffffff) {
                uVar15 = 0x7f000000;
              }
            }
            else {
              uVar15 = (ulong)(uint)(src->green[bVar1] * 0x100 +
                                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 +
                                    src->blue[bVar1]);
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar25,iVar12);
          uVar43 = (ulong)uVar41;
          if (iVar6 != 0) {
            bVar1 = src->pixels[iVar12][iVar25];
            if (src->transparent == (uint)bVar1) {
              uVar43 = (ulong)uVar41;
              if (uVar41 == 0xffffffff) {
                uVar43 = 0x7f000000;
              }
            }
            else {
              uVar43 = (ulong)(uint)(src->green[bVar1] * 0x100 +
                                     src->red[bVar1] * 0x10000 + src->alpha[bVar1] * 0x1000000 +
                                    src->blue[bVar1]);
            }
          }
          lVar35 = (lVar21 >> 8) + (lVar21 >> 0x10) * -0x100;
          uVar5 = (uint)uVar15;
          uVar40 = (uint)uVar43;
          iVar29 = (int)((ulong)((0x100 - lVar35) * (0x100 - lVar33)) >> 8);
          iVar25 = (int)((ulong)(lVar35 * (0x100 - lVar33)) >> 8);
          iVar19 = (int)((ulong)((0x100 - lVar35) * lVar33) >> 8);
          iVar6 = (int)((ulong)(lVar35 * lVar33) >> 8);
          pgVar7->tpixels[uVar9][uVar32] =
               ((uVar40 & 0xff) * 0x100 * iVar6 >> 8) + ((uVar5 & 0xff) * 0x100 * iVar19 >> 8) +
               ((uVar38 & 0xff) * 0x100 * iVar25 >> 8) + ((uVar41 & 0xff) * 0x100 * iVar29 >> 8) >>
               8 & 0xff |
               ((uVar40 & 0xff00) * iVar6 >> 8) + ((uVar5 & 0xff00) * iVar19 >> 8) +
               ((uVar38 & 0xff00) * iVar25 >> 8) + ((uVar41 & 0xff00) * iVar29 >> 8) & 0xff00 |
               ((((uint)(uVar43 >> 8) & 0xff00) * iVar6 >> 8) +
                (((uint)(uVar15 >> 8) & 0xff00) * iVar19 >> 8) +
                ((uVar38 >> 8 & 0xff00) * iVar25 >> 8) + ((uVar41 >> 8 & 0xff00) * iVar29 >> 8) &
               0xff00) << 8 |
               (((uVar40 >> 0x10 & 0x7f00) * iVar6 >> 8) + ((uVar5 >> 0x10 & 0x7f00) * iVar19 >> 8)
                + ((uVar38 >> 0x10 & 0x7f00) * iVar25 >> 8) +
                  ((uVar41 >> 0x10 & 0x7f00) * iVar29 >> 8) & 0xff00) << 0x10;
          uVar32 = uVar32 + 1;
          lVar21 = lVar21 + lVar10 * 0x100;
        } while (uVar17 != uVar32);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar16);
      return pgVar7;
    }
  }
  else {
    pgVar7 = gdImageCreateTrueColor(new_width,new_height);
    if (pgVar7 != (gdImagePtr)0x0) {
      uVar9 = 0;
      do {
        lVar21 = uVar9 * lVar20 * 0x100;
        lVar33 = (lVar21 >> 8) + (lVar21 >> 0x10) * -0x100;
        iVar39 = (int)((ulong)lVar21 >> 0x10);
        iVar12 = iVar39 + 1;
        lVar21 = 0;
        uVar32 = 0;
        do {
          iVar19 = (int)((ulong)lVar21 >> 0x10);
          iVar6 = gdImageBoundsSafe(src,iVar19,iVar39);
          if (iVar6 == 0) {
            uVar41 = 0;
          }
          else {
            uVar41 = 0;
            if (src->tpixels[iVar39][iVar19] != src->transparent) {
              uVar41 = src->tpixels[iVar39][iVar19];
            }
          }
          iVar25 = iVar19 + 1;
          iVar6 = gdImageBoundsSafe(src,iVar25,iVar39);
          uVar15 = (ulong)uVar41;
          if (iVar6 != 0) {
            uVar15 = 0x7f000000;
            if (uVar41 != 0xffffffff) {
              uVar15 = (ulong)uVar41;
            }
            if (src->tpixels[iVar39][iVar25] != src->transparent) {
              uVar15 = (ulong)(uint)src->tpixels[iVar39][iVar25];
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar19,iVar12);
          uVar43 = (ulong)uVar41;
          if (iVar6 != 0) {
            uVar43 = 0x7f000000;
            if (uVar41 != 0xffffffff) {
              uVar43 = (ulong)uVar41;
            }
            if (src->tpixels[iVar12][iVar19] != src->transparent) {
              uVar43 = (ulong)(uint)src->tpixels[iVar12][iVar19];
            }
          }
          iVar6 = gdImageBoundsSafe(src,iVar25,iVar12);
          uVar38 = uVar41;
          if (iVar6 != 0) {
            uVar38 = 0x7f000000;
            if (uVar41 != 0xffffffff) {
              uVar38 = uVar41;
            }
            if (src->tpixels[iVar12][iVar25] != src->transparent) {
              uVar38 = src->tpixels[iVar12][iVar25];
            }
          }
          lVar35 = (lVar21 >> 8) + (lVar21 >> 0x10) * -0x100;
          uVar40 = (uint)uVar15;
          uVar5 = (uint)uVar43;
          iVar29 = (int)((ulong)((0x100 - lVar35) * (0x100 - lVar33)) >> 8);
          iVar25 = (int)((ulong)(lVar35 * (0x100 - lVar33)) >> 8);
          iVar19 = (int)((ulong)((0x100 - lVar35) * lVar33) >> 8);
          iVar6 = (int)((ulong)(lVar35 * lVar33) >> 8);
          pgVar7->tpixels[uVar9][uVar32] =
               ((uVar38 & 0xff) * 0x100 * iVar6 >> 8) + ((uVar5 & 0xff) * 0x100 * iVar19 >> 8) +
               ((uVar40 & 0xff) * 0x100 * iVar25 >> 8) + ((uVar41 & 0xff) * 0x100 * iVar29 >> 8) >>
               8 & 0xff |
               ((uVar38 & 0xff00) * iVar6 >> 8) + ((uVar5 & 0xff00) * iVar19 >> 8) +
               ((uVar40 & 0xff00) * iVar25 >> 8) + ((uVar41 & 0xff00) * iVar29 >> 8) & 0xff00 |
               (((uVar38 >> 8 & 0xff00) * iVar6 >> 8) +
                (((uint)(uVar43 >> 8) & 0xff00) * iVar19 >> 8) +
                (((uint)(uVar15 >> 8) & 0xff00) * iVar25 >> 8) +
                ((uVar41 >> 8 & 0xff00) * iVar29 >> 8) & 0xff00) << 8 |
               (((uVar38 >> 0x10 & 0x7f00) * iVar6 >> 8) + ((uVar5 >> 0x10 & 0x7f00) * iVar19 >> 8)
                + ((uVar40 >> 0x10 & 0x7f00) * iVar25 >> 8) +
                  ((uVar41 >> 0x10 & 0x7f00) * iVar29 >> 8) & 0xff00) << 0x10;
          uVar32 = uVar32 + 1;
          lVar21 = lVar21 + lVar10 * 0x100;
        } while (uVar17 != uVar32);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar16);
      return pgVar7;
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageScale(const gdImagePtr src, const unsigned int new_width, const unsigned int new_height)
{
	gdImagePtr im_scaled = NULL;

	if (src == NULL || (uintmax_t)src->interpolation_id >= GD_METHOD_COUNT) {
		return NULL;
	}

	if (new_width == 0 || new_height == 0) {
		return NULL;
	}
	if (new_width == gdImageSX(src) && new_height == gdImageSY(src)) {
		return gdImageClone(src);
	}
	switch (src->interpolation_id) {
		/*Special cases, optimized implementations */
		case GD_NEAREST_NEIGHBOUR:
			im_scaled = gdImageScaleNearestNeighbour(src, new_width, new_height);
			break;

		case GD_BILINEAR_FIXED:
		case GD_LINEAR:
			im_scaled = gdImageScaleBilinear(src, new_width, new_height);
			break;

		case GD_BICUBIC_FIXED:
		case GD_BICUBIC:
			im_scaled = gdImageScaleBicubicFixed(src, new_width, new_height);
			break;

		/* generic */
		default:
			if (src->interpolation == NULL) {
				return NULL;
			}
			im_scaled = gdImageScaleTwoPass(src, new_width, new_height);
			break;
	}

	return im_scaled;
}